

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O1

bool __thiscall
OpenMD::ForceMatrixDecomposition::skipAtomPair
          (ForceMatrixDecomposition *this,int atom1,int atom2,int cg1,int cg2)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  bool bVar4;
  
  piVar3 = (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar3[atom1];
  iVar2 = piVar3[atom2];
  bVar4 = true;
  if (iVar1 != iVar2) {
    piVar3 = (this->cgLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar4 = iVar1 < iVar2 && piVar3[cg1] == piVar3[cg2];
  }
  return bVar4;
}

Assistant:

bool ForceMatrixDecomposition::skipAtomPair(int atom1, int atom2, int cg1,
                                              int cg2) {
    int unique_id_1 = AtomLocalToGlobal[atom1];
    int unique_id_2 = AtomLocalToGlobal[atom2];
    int group1      = cgLocalToGlobal[cg1];
    int group2      = cgLocalToGlobal[cg2];

    if (unique_id_1 == unique_id_2) return true;

    if (group1 == group2) {
      if (unique_id_1 < unique_id_2) return true;
    }

    return false;
  }